

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_rotate.cpp
# Opt level: O2

size_t embree::avx::BVHNRotate<4>::rotate(NodeRef parentRef,size_t depth)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t sVar18;
  long lVar19;
  ssize_t i;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined4 uVar23;
  long in_R8;
  ulong uVar25;
  long in_R9;
  ulong uVar26;
  long in_R10;
  ulong uVar27;
  size_t c;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float local_1ac;
  int pos [4];
  vint4 cdepth;
  vfloat4 area0123;
  vfloat4 childArea;
  ulong uVar24;
  
  if ((parentRef.ptr & 0x8000000000000008) == 0) {
    for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
      sVar18 = rotate((NodeRef)*(size_t *)(parentRef.ptr + lVar28 * 8),depth + 1);
      cdepth.field_0.i[lVar28] = (int)sVar18;
    }
    auVar4 = *(undefined1 (*) [16])(parentRef.ptr + 0x20);
    auVar5 = *(undefined1 (*) [16])(parentRef.ptr + 0x30);
    auVar6 = *(undefined1 (*) [16])(parentRef.ptr + 0x40);
    auVar7 = *(undefined1 (*) [16])(parentRef.ptr + 0x50);
    auVar11 = vsubps_avx(auVar5,auVar4);
    auVar12 = vsubps_avx(auVar7,auVar6);
    auVar8 = *(undefined1 (*) [16])(parentRef.ptr + 0x70);
    auVar9 = *(undefined1 (*) [16])(parentRef.ptr + 0x60);
    auVar32 = vsubps_avx(auVar8,auVar9);
    childArea.field_0.v[0] =
         auVar32._0_4_ * auVar12._0_4_ + (auVar32._0_4_ + auVar12._0_4_) * auVar11._0_4_;
    childArea.field_0.v[1] =
         auVar32._4_4_ * auVar12._4_4_ + (auVar32._4_4_ + auVar12._4_4_) * auVar11._4_4_;
    childArea.field_0.v[2] =
         auVar32._8_4_ * auVar12._8_4_ + (auVar32._8_4_ + auVar12._8_4_) * auVar11._8_4_;
    childArea.field_0.v[3] =
         auVar32._12_4_ * auVar12._12_4_ + (auVar32._12_4_ + auVar12._12_4_) * auVar11._12_4_;
    auVar11 = vunpcklps_avx(auVar4,auVar9);
    auVar4 = vunpckhps_avx(auVar4,auVar9);
    auVar49 = ZEXT816(0) << 0x20;
    auVar9 = vunpcklps_avx(auVar6,auVar49);
    auVar6 = vunpckhps_avx(auVar6,auVar49);
    auVar12 = vunpcklps_avx(auVar11,auVar9);
    auVar9 = vunpckhps_avx(auVar11,auVar9);
    auVar11 = vunpcklps_avx(auVar4,auVar6);
    auVar6 = vunpckhps_avx(auVar4,auVar6);
    auVar32 = vunpcklps_avx(auVar5,auVar8);
    auVar4 = vunpckhps_avx(auVar5,auVar8);
    auVar8 = vunpcklps_avx(auVar7,auVar49);
    auVar5 = vunpckhps_avx(auVar7,auVar49);
    auVar49 = vunpcklps_avx(auVar32,auVar8);
    auVar7 = vunpckhps_avx(auVar32,auVar8);
    auVar8 = vunpcklps_avx(auVar4,auVar5);
    auVar5 = vunpckhps_avx(auVar4,auVar5);
    auVar4 = vpshufd_avx(ZEXT416((int)depth + 1),0);
    auVar4 = vpaddd_avx(auVar4,(undefined1  [16])cdepth.field_0);
    local_1ac = 0.0;
    lVar28 = -1;
    lVar22 = 0;
    auVar32._8_4_ = 0x20;
    auVar32._0_8_ = 0x2000000020;
    auVar32._12_4_ = 0x20;
    auVar4 = vpcmpgtd_avx(auVar4,auVar32);
    lVar21 = lVar28;
    lVar20 = lVar28;
    for (; lVar22 != 4; lVar22 = lVar22 + 1) {
      uVar24 = *(ulong *)(parentRef.ptr + lVar22 * 8);
      if ((uVar24 & 0x8000000000000008) == 0) {
        auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(uVar24 + 0x20),
                                *(undefined1 (*) [16])(uVar24 + 0x60));
        auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(uVar24 + 0x20),
                                *(undefined1 (*) [16])(uVar24 + 0x60));
        auVar29 = ZEXT816(0) << 0x40;
        auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(uVar24 + 0x40),auVar29);
        auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(uVar24 + 0x40),auVar29);
        auVar14 = vunpcklps_avx(auVar33,auVar36);
        auVar37 = vunpckhps_avx(auVar33,auVar36);
        auVar15 = vunpcklps_avx(auVar32,auVar35);
        auVar31 = vunpckhps_avx(auVar32,auVar35);
        auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(uVar24 + 0x30),
                                *(undefined1 (*) [16])(uVar24 + 0x70));
        auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(uVar24 + 0x30),
                                *(undefined1 (*) [16])(uVar24 + 0x70));
        auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(uVar24 + 0x50),auVar29);
        auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(uVar24 + 0x50),auVar29);
        auVar16 = vunpcklps_avx(auVar33,auVar36);
        auVar38 = vunpckhps_avx(auVar33,auVar36);
        auVar17 = vunpcklps_avx(auVar32,auVar35);
        auVar13 = vunpckhps_avx(auVar32,auVar35);
        auVar35 = vminps_avx(auVar12,auVar37);
        auVar32 = vmaxps_avx(auVar49,auVar38);
        auVar30 = vminps_avx(auVar15,auVar31);
        auVar36 = vmaxps_avx(auVar17,auVar13);
        auVar35 = vminps_avx(auVar35,auVar30);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar39._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar39._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar39._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar39._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar35 = vminps_avx(auVar14,auVar12);
        auVar32 = vmaxps_avx(auVar16,auVar49);
        auVar35 = vminps_avx(auVar35,auVar30);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar45._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar45._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar45._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar45._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar34 = vminps_avx(auVar14,auVar37);
        auVar29 = vmaxps_avx(auVar16,auVar38);
        auVar35 = vminps_avx(auVar12,auVar31);
        auVar32 = vmaxps_avx(auVar49,auVar13);
        auVar35 = vminps_avx(auVar34,auVar35);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar50._0_4_ = auVar32._0_4_ * auVar35._0_4_;
        auVar50._4_4_ = auVar32._4_4_ * auVar35._4_4_;
        auVar50._8_4_ = auVar32._8_4_ * auVar35._8_4_;
        auVar50._12_4_ = auVar32._12_4_ * auVar35._12_4_;
        auVar32 = vminps_avx(auVar15,auVar12);
        auVar35 = vminps_avx(auVar34,auVar32);
        auVar32 = vmaxps_avx(auVar17,auVar49);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar53._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar53._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar53._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar53._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vunpcklps_avx(auVar39,auVar45);
        auVar32 = vmovlhps_avx(auVar32,auVar50);
        auVar32 = vinsertps_avx(auVar32,auVar53,0x30);
        auVar35 = vinsertps_avx(auVar45,auVar39,0x4c);
        auVar35 = vshufps_avx(auVar35,auVar50,0xd4);
        auVar35 = vinsertps_avx(auVar35,auVar53,0x70);
        auVar33 = vunpckhps_avx(auVar39,auVar45);
        auVar40._0_8_ = auVar33._0_8_;
        auVar40._8_8_ = auVar50._8_8_;
        auVar33 = vinsertps_avx(auVar40,auVar53,0xb0);
        auVar46._0_4_ = auVar32._0_4_ + auVar35._0_4_ + auVar33._0_4_;
        auVar46._4_4_ = auVar32._4_4_ + auVar35._4_4_ + auVar33._4_4_;
        auVar46._8_4_ = auVar32._8_4_ + auVar35._8_4_ + auVar33._8_4_;
        auVar46._12_4_ = auVar32._12_4_ + auVar35._12_4_ + auVar33._12_4_;
        auVar32 = vshufps_avx(auVar46,auVar46,0xb1);
        auVar32 = vminps_avx(auVar32,auVar46);
        auVar35 = vshufpd_avx(auVar32,auVar32,1);
        auVar39 = vminps_avx(auVar35,auVar32);
        auVar32 = vcmpps_avx(auVar39,auVar46,0);
        uVar23 = vmovmskps_avx(auVar32);
        uVar24 = CONCAT44((int)(uVar24 >> 0x20),uVar23);
        auVar35 = vminps_avx(auVar9,auVar37);
        auVar32 = vmaxps_avx(auVar7,auVar38);
        auVar35 = vminps_avx(auVar35,auVar30);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar47._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar47._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar47._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar47._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar35 = vminps_avx(auVar14,auVar9);
        auVar32 = vmaxps_avx(auVar16,auVar7);
        auVar35 = vminps_avx(auVar35,auVar30);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar51._0_4_ = auVar32._0_4_ * auVar35._0_4_;
        auVar51._4_4_ = auVar32._4_4_ * auVar35._4_4_;
        auVar51._8_4_ = auVar32._8_4_ * auVar35._8_4_;
        auVar51._12_4_ = auVar32._12_4_ * auVar35._12_4_;
        auVar32 = vminps_avx(auVar9,auVar31);
        auVar35 = vminps_avx(auVar34,auVar32);
        auVar32 = vmaxps_avx(auVar7,auVar13);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar54._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar54._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar54._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar54._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vminps_avx(auVar15,auVar9);
        auVar35 = vminps_avx(auVar34,auVar32);
        auVar32 = vmaxps_avx(auVar17,auVar7);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar56._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar56._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar56._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar56._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vunpcklps_avx(auVar47,auVar51);
        auVar32 = vmovlhps_avx(auVar32,auVar54);
        auVar32 = vinsertps_avx(auVar32,auVar56,0x30);
        auVar35 = vinsertps_avx(auVar51,auVar47,0x4c);
        auVar35 = vshufps_avx(auVar35,auVar54,0xd4);
        auVar35 = vinsertps_avx(auVar35,auVar56,0x70);
        auVar33 = vunpckhps_avx(auVar47,auVar51);
        auVar48._0_8_ = auVar33._0_8_;
        auVar48._8_8_ = auVar54._8_8_;
        auVar33 = vinsertps_avx(auVar48,auVar56,0xb0);
        auVar41._0_4_ = auVar33._0_4_ + auVar32._0_4_ + auVar35._0_4_;
        auVar41._4_4_ = auVar33._4_4_ + auVar32._4_4_ + auVar35._4_4_;
        auVar41._8_4_ = auVar33._8_4_ + auVar32._8_4_ + auVar35._8_4_;
        auVar41._12_4_ = auVar33._12_4_ + auVar32._12_4_ + auVar35._12_4_;
        auVar32 = vshufps_avx(auVar41,auVar41,0xb1);
        auVar32 = vminps_avx(auVar32,auVar41);
        auVar35 = vshufpd_avx(auVar32,auVar32,1);
        auVar40 = vminps_avx(auVar35,auVar32);
        auVar32 = vcmpps_avx(auVar40,auVar41,0);
        uVar23 = vmovmskps_avx(auVar32);
        uVar25 = CONCAT44((int)((ulong)in_R8 >> 0x20),uVar23);
        auVar35 = vminps_avx(auVar11,auVar37);
        auVar32 = vmaxps_avx(auVar8,auVar38);
        auVar35 = vminps_avx(auVar35,auVar30);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar42._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar42._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar42._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar42._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vminps_avx(auVar14,auVar11);
        auVar35 = vminps_avx(auVar32,auVar30);
        auVar32 = vmaxps_avx(auVar16,auVar8);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar52._0_4_ = auVar32._0_4_ * auVar35._0_4_;
        auVar52._4_4_ = auVar32._4_4_ * auVar35._4_4_;
        auVar52._8_4_ = auVar32._8_4_ * auVar35._8_4_;
        auVar52._12_4_ = auVar32._12_4_ * auVar35._12_4_;
        auVar32 = vminps_avx(auVar11,auVar31);
        auVar35 = vminps_avx(auVar34,auVar32);
        auVar32 = vmaxps_avx(auVar8,auVar13);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar55._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar55._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar55._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar55._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vminps_avx(auVar15,auVar11);
        auVar35 = vminps_avx(auVar34,auVar32);
        auVar32 = vmaxps_avx(auVar17,auVar8);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar57._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar57._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar57._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar57._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vunpcklps_avx(auVar42,auVar52);
        auVar32 = vmovlhps_avx(auVar32,auVar55);
        auVar32 = vinsertps_avx(auVar32,auVar57,0x30);
        auVar35 = vinsertps_avx(auVar52,auVar42,0x4c);
        auVar35 = vshufps_avx(auVar35,auVar55,0xd4);
        auVar35 = vinsertps_avx(auVar35,auVar57,0x70);
        auVar33 = vunpckhps_avx(auVar42,auVar52);
        auVar43._0_8_ = auVar33._0_8_;
        auVar43._8_8_ = auVar55._8_8_;
        auVar33 = vinsertps_avx(auVar43,auVar57,0xb0);
        auVar44._0_4_ = auVar33._0_4_ + auVar32._0_4_ + auVar35._0_4_;
        auVar44._4_4_ = auVar33._4_4_ + auVar32._4_4_ + auVar35._4_4_;
        auVar44._8_4_ = auVar33._8_4_ + auVar32._8_4_ + auVar35._8_4_;
        auVar44._12_4_ = auVar33._12_4_ + auVar32._12_4_ + auVar35._12_4_;
        auVar32 = vshufps_avx(auVar44,auVar44,0xb1);
        auVar32 = vminps_avx(auVar32,auVar44);
        auVar35 = vshufpd_avx(auVar32,auVar32,1);
        auVar41 = vminps_avx(auVar35,auVar32);
        auVar32 = vcmpps_avx(auVar41,auVar44,0);
        uVar23 = vmovmskps_avx(auVar32);
        uVar26 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar23);
        auVar35 = vminps_avx(auVar6,auVar37);
        auVar32 = vmaxps_avx(auVar5,auVar38);
        auVar35 = vminps_avx(auVar35,auVar30);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar38._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar38._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar38._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar38._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vminps_avx(auVar14,auVar6);
        auVar35 = vminps_avx(auVar32,auVar30);
        auVar32 = vmaxps_avx(auVar16,auVar5);
        auVar32 = vmaxps_avx(auVar32,auVar36);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar33._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar33._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar33._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar33._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar35 = vminps_avx(auVar6,auVar31);
        auVar32 = vmaxps_avx(auVar5,auVar13);
        auVar35 = vminps_avx(auVar34,auVar35);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar37._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar37._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar37._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar37._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vminps_avx(auVar15,auVar6);
        auVar35 = vminps_avx(auVar34,auVar32);
        auVar32 = vmaxps_avx(auVar17,auVar5);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        auVar35 = vsubps_avx(auVar32,auVar35);
        auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
        auVar29._0_4_ = auVar35._0_4_ * auVar32._0_4_;
        auVar29._4_4_ = auVar35._4_4_ * auVar32._4_4_;
        auVar29._8_4_ = auVar35._8_4_ * auVar32._8_4_;
        auVar29._12_4_ = auVar35._12_4_ * auVar32._12_4_;
        auVar32 = vunpcklps_avx(auVar38,auVar33);
        auVar32 = vmovlhps_avx(auVar32,auVar37);
        auVar32 = vinsertps_avx(auVar32,auVar29,0x30);
        auVar35 = vinsertps_avx(auVar33,auVar38,0x4c);
        auVar35 = vshufps_avx(auVar35,auVar37,0xd4);
        auVar35 = vinsertps_avx(auVar35,auVar29,0x70);
        auVar33 = vunpckhps_avx(auVar38,auVar33);
        auVar36 = vpcmpeqd_avx(auVar38,auVar38);
        auVar34._0_8_ = auVar33._0_8_;
        auVar34._8_8_ = auVar37._8_8_;
        auVar33 = vinsertps_avx(auVar34,auVar29,0xb0);
        auVar30._0_4_ = auVar33._0_4_ + auVar32._0_4_ + auVar35._0_4_;
        auVar30._4_4_ = auVar33._4_4_ + auVar32._4_4_ + auVar35._4_4_;
        auVar30._8_4_ = auVar33._8_4_ + auVar32._8_4_ + auVar35._8_4_;
        auVar30._12_4_ = auVar33._12_4_ + auVar32._12_4_ + auVar35._12_4_;
        auVar32 = vshufps_avx(auVar30,auVar30,0xb1);
        auVar32 = vminps_avx(auVar32,auVar30);
        auVar35 = vshufpd_avx(auVar32,auVar32,1);
        auVar35 = vminps_avx(auVar35,auVar32);
        auVar32 = vcmpps_avx(auVar35,auVar30,0);
        uVar23 = vmovmskps_avx(auVar32);
        uVar27 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar23);
        auVar32 = vunpcklps_avx(auVar39,auVar40);
        auVar32 = vmovlhps_avx(auVar32,auVar41);
        lVar19 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        in_R8 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> in_R8 & 1) == 0; in_R8 = in_R8 + 1) {
          }
        }
        in_R9 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> in_R9 & 1) == 0; in_R9 = in_R9 + 1) {
          }
        }
        in_R10 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> in_R10 & 1) == 0; in_R10 = in_R10 + 1) {
          }
        }
        auVar32 = vinsertps_avx(auVar32,auVar35,0x30);
        iVar3 = childArea.field_0.i[lVar22];
        auVar35._4_4_ = iVar3;
        auVar35._0_4_ = iVar3;
        auVar35._8_4_ = iVar3;
        auVar35._12_4_ = iVar3;
        area0123.field_0 =
             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vsubps_avx(auVar32,auVar35);
        pos[0] = (int)lVar19;
        pos[1] = (int)in_R8;
        pos[2] = (int)in_R9;
        pos[3] = (int)in_R10;
        auVar32 = vpshufd_avx(ZEXT416((uint)lVar22),0);
        auVar32 = vpcmpeqd_avx(auVar32,_DAT_01f4ad30);
        auVar32 = vpor_avx(auVar32,auVar4);
        auVar35 = auVar36 & ~auVar32;
        if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar35[0xf] < '\0') {
          auVar31._0_4_ = auVar32._0_4_ ^ auVar36._0_4_;
          auVar31._4_4_ = auVar32._4_4_ ^ auVar36._4_4_;
          auVar31._8_4_ = auVar32._8_4_ ^ auVar36._8_4_;
          auVar31._12_4_ = auVar32._12_4_ ^ auVar36._12_4_;
          auVar36._8_4_ = 0x7f800000;
          auVar36._0_8_ = 0x7f8000007f800000;
          auVar36._12_4_ = 0x7f800000;
          auVar32 = vblendvps_avx(auVar36,(undefined1  [16])area0123.field_0,auVar31);
          auVar35 = vshufps_avx(auVar32,auVar32,0xb1);
          auVar35 = vminps_avx(auVar35,auVar32);
          auVar33 = vshufpd_avx(auVar35,auVar35,1);
          auVar35 = vminps_avx(auVar33,auVar35);
          auVar32 = vcmpps_avx(auVar32,auVar35,0);
          auVar35 = auVar31 & auVar32;
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') {
            auVar31 = vandps_avx(auVar32,auVar31);
          }
          uVar23 = vmovmskps_avx(auVar31);
          uVar24 = CONCAT44((int)((ulong)lVar19 >> 0x20),uVar23);
          lVar19 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          if ((lVar22 != lVar19) && (area0123.field_0.v[lVar19] < local_1ac)) {
            lVar20 = (long)pos[lVar19];
            lVar28 = lVar19;
            lVar21 = lVar22;
            local_1ac = area0123.field_0.v[lVar19];
          }
        }
      }
    }
    if (lVar28 != -1) {
      lVar22 = *(long *)(parentRef.ptr + lVar21 * 8);
      uVar10 = *(undefined8 *)(parentRef.ptr + lVar28 * 8);
      *(undefined8 *)(parentRef.ptr + lVar28 * 8) = *(undefined8 *)(lVar22 + lVar20 * 8);
      *(undefined8 *)(lVar22 + lVar20 * 8) = uVar10;
      uVar23 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar28 * 4);
      *(undefined4 *)(parentRef.ptr + 0x20 + lVar28 * 4) =
           *(undefined4 *)(lVar22 + 0x20 + lVar20 * 4);
      *(undefined4 *)(lVar22 + 0x20 + lVar20 * 4) = uVar23;
      uVar23 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar28 * 4);
      *(undefined4 *)(parentRef.ptr + 0x40 + lVar28 * 4) =
           *(undefined4 *)(lVar22 + 0x40 + lVar20 * 4);
      *(undefined4 *)(lVar22 + 0x40 + lVar20 * 4) = uVar23;
      uVar23 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar28 * 4);
      *(undefined4 *)(parentRef.ptr + 0x60 + lVar28 * 4) =
           *(undefined4 *)(lVar22 + 0x60 + lVar20 * 4);
      *(undefined4 *)(lVar22 + 0x60 + lVar20 * 4) = uVar23;
      uVar23 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar28 * 4);
      *(undefined4 *)(parentRef.ptr + 0x30 + lVar28 * 4) =
           *(undefined4 *)(lVar22 + 0x30 + lVar20 * 4);
      *(undefined4 *)(lVar22 + 0x30 + lVar20 * 4) = uVar23;
      uVar23 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar28 * 4);
      *(undefined4 *)(parentRef.ptr + 0x50 + lVar28 * 4) =
           *(undefined4 *)(lVar22 + 0x50 + lVar20 * 4);
      *(undefined4 *)(lVar22 + 0x50 + lVar20 * 4) = uVar23;
      uVar23 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar28 * 4);
      *(undefined4 *)(parentRef.ptr + 0x70 + lVar28 * 4) =
           *(undefined4 *)(lVar22 + 0x70 + lVar20 * 4);
      *(undefined4 *)(lVar22 + 0x70 + lVar20 * 4) = uVar23;
      auVar4 = *(undefined1 (*) [16])(lVar22 + 0x20);
      auVar5 = *(undefined1 (*) [16])(lVar22 + 0x30);
      auVar6 = *(undefined1 (*) [16])(lVar22 + 0x40);
      auVar7 = *(undefined1 (*) [16])(lVar22 + 0x50);
      auVar8 = vshufps_avx(auVar4,auVar4,0xb1);
      auVar4 = vminps_avx(auVar8,auVar4);
      auVar8 = vshufpd_avx(auVar4,auVar4,1);
      auVar8 = vminss_avx(auVar8,auVar4);
      auVar4 = vshufps_avx(auVar6,auVar6,0xb1);
      auVar4 = vminps_avx(auVar4,auVar6);
      auVar6 = vshufpd_avx(auVar4,auVar4,1);
      auVar9 = vminss_avx(auVar6,auVar4);
      auVar4 = *(undefined1 (*) [16])(lVar22 + 0x60);
      auVar6 = vshufps_avx(auVar4,auVar4,0xb1);
      auVar4 = vminps_avx(auVar6,auVar4);
      auVar6 = vshufpd_avx(auVar4,auVar4,1);
      auVar11 = vminss_avx(auVar6,auVar4);
      auVar4 = vshufps_avx(auVar5,auVar5,0xb1);
      auVar4 = vmaxps_avx(auVar4,auVar5);
      auVar5 = vshufpd_avx(auVar4,auVar4,1);
      auVar5 = vmaxss_avx(auVar5,auVar4);
      auVar4 = vshufps_avx(auVar7,auVar7,0xb1);
      auVar4 = vmaxps_avx(auVar4,auVar7);
      auVar6 = vshufpd_avx(auVar4,auVar4,1);
      auVar6 = vmaxss_avx(auVar6,auVar4);
      auVar4 = *(undefined1 (*) [16])(lVar22 + 0x70);
      auVar7 = vshufps_avx(auVar4,auVar4,0xb1);
      auVar4 = vmaxps_avx(auVar7,auVar4);
      auVar7 = vshufpd_avx(auVar4,auVar4,1);
      auVar4 = vmaxss_avx(auVar7,auVar4);
      *(int *)(parentRef.ptr + 0x20 + lVar21 * 4) = auVar8._0_4_;
      *(int *)(parentRef.ptr + 0x40 + lVar21 * 4) = auVar9._0_4_;
      *(int *)(parentRef.ptr + 0x60 + lVar21 * 4) = auVar11._0_4_;
      *(int *)(parentRef.ptr + 0x30 + lVar21 * 4) = auVar5._0_4_;
      *(int *)(parentRef.ptr + 0x50 + lVar21 * 4) = auVar6._0_4_;
      *(int *)(parentRef.ptr + 0x70 + lVar21 * 4) = auVar4._0_4_;
      for (lVar21 = 3;
          (lVar20 = -1, -1 < lVar21 && (lVar20 = lVar21, *(long *)(parentRef.ptr + lVar21 * 8) == 8)
          ); lVar21 = lVar21 + -1) {
      }
      for (lVar21 = 0; lVar21 < lVar20; lVar21 = lVar21 + 1) {
        if (*(long *)(parentRef.ptr + lVar21 * 8) == 8) {
          *(undefined8 *)(parentRef.ptr + lVar21 * 8) = *(undefined8 *)(parentRef.ptr + lVar20 * 8);
          *(undefined8 *)(parentRef.ptr + lVar20 * 8) = 8;
          uVar23 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar21 * 4);
          *(undefined4 *)(parentRef.ptr + 0x20 + lVar21 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x20 + lVar20 * 4);
          *(undefined4 *)(parentRef.ptr + 0x20 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar21 * 4);
          *(undefined4 *)(parentRef.ptr + 0x40 + lVar21 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x40 + lVar20 * 4);
          *(undefined4 *)(parentRef.ptr + 0x40 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar21 * 4);
          *(undefined4 *)(parentRef.ptr + 0x60 + lVar21 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x60 + lVar20 * 4);
          *(undefined4 *)(parentRef.ptr + 0x60 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar21 * 4);
          *(undefined4 *)(parentRef.ptr + 0x30 + lVar21 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x30 + lVar20 * 4);
          *(undefined4 *)(parentRef.ptr + 0x30 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar21 * 4);
          *(undefined4 *)(parentRef.ptr + 0x50 + lVar21 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x50 + lVar20 * 4);
          *(undefined4 *)(parentRef.ptr + 0x50 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar21 * 4);
          *(undefined4 *)(parentRef.ptr + 0x70 + lVar21 * 4) =
               *(undefined4 *)(parentRef.ptr + 0x70 + lVar20 * 4);
          *(undefined4 *)(parentRef.ptr + 0x70 + lVar20 * 4) = uVar23;
          lVar19 = lVar20;
          do {
            lVar1 = lVar19 + -1;
            lVar20 = lVar21;
            if (lVar1 <= lVar21) break;
            lVar2 = lVar19 * 8;
            lVar19 = lVar1;
            lVar20 = lVar1;
          } while (*(long *)((parentRef.ptr - 8) + lVar2) == 8);
        }
      }
      for (lVar21 = 3;
          (lVar20 = -1, -1 < lVar21 && (lVar20 = lVar21, *(long *)(lVar22 + lVar21 * 8) == 8));
          lVar21 = lVar21 + -1) {
      }
      for (lVar21 = 0; lVar21 < lVar20; lVar21 = lVar21 + 1) {
        if (*(long *)(lVar22 + lVar21 * 8) == 8) {
          *(undefined8 *)(lVar22 + lVar21 * 8) = *(undefined8 *)(lVar22 + lVar20 * 8);
          *(undefined8 *)(lVar22 + lVar20 * 8) = 8;
          uVar23 = *(undefined4 *)(lVar22 + 0x20 + lVar21 * 4);
          *(undefined4 *)(lVar22 + 0x20 + lVar21 * 4) = *(undefined4 *)(lVar22 + 0x20 + lVar20 * 4);
          *(undefined4 *)(lVar22 + 0x20 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(lVar22 + 0x40 + lVar21 * 4);
          *(undefined4 *)(lVar22 + 0x40 + lVar21 * 4) = *(undefined4 *)(lVar22 + 0x40 + lVar20 * 4);
          *(undefined4 *)(lVar22 + 0x40 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(lVar22 + 0x60 + lVar21 * 4);
          *(undefined4 *)(lVar22 + 0x60 + lVar21 * 4) = *(undefined4 *)(lVar22 + 0x60 + lVar20 * 4);
          *(undefined4 *)(lVar22 + 0x60 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(lVar22 + 0x30 + lVar21 * 4);
          *(undefined4 *)(lVar22 + 0x30 + lVar21 * 4) = *(undefined4 *)(lVar22 + 0x30 + lVar20 * 4);
          *(undefined4 *)(lVar22 + 0x30 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(lVar22 + 0x50 + lVar21 * 4);
          *(undefined4 *)(lVar22 + 0x50 + lVar21 * 4) = *(undefined4 *)(lVar22 + 0x50 + lVar20 * 4);
          *(undefined4 *)(lVar22 + 0x50 + lVar20 * 4) = uVar23;
          uVar23 = *(undefined4 *)(lVar22 + 0x70 + lVar21 * 4);
          *(undefined4 *)(lVar22 + 0x70 + lVar21 * 4) = *(undefined4 *)(lVar22 + 0x70 + lVar20 * 4);
          *(undefined4 *)(lVar22 + 0x70 + lVar20 * 4) = uVar23;
          lVar19 = lVar20;
          do {
            lVar1 = lVar19 + -1;
            lVar20 = lVar21;
            if (lVar1 <= lVar21) break;
            lVar2 = lVar19 * 8;
            lVar19 = lVar1;
            lVar20 = lVar1;
          } while (*(long *)(lVar22 + -8 + lVar2) == 8);
        }
      }
      cdepth.field_0.i[lVar28] = cdepth.field_0.i[lVar28] + 1;
    }
    auVar4 = vpshufd_avx((undefined1  [16])cdepth.field_0,0xb1);
    auVar4 = vpmaxsd_avx(auVar4,(undefined1  [16])cdepth.field_0);
    auVar5 = vpshufd_avx(auVar4,0x4e);
    auVar4 = vpmaxsd_avx(auVar5,auVar4);
    sVar18 = (size_t)(auVar4._0_4_ + 1);
  }
  else {
    sVar18 = 0;
  }
  return sVar18;
}

Assistant:

size_t BVHNRotate<4>::rotate(NodeRef parentRef, size_t depth)
    {
      /*! nothing to rotate if we reached a leaf node. */
      if (parentRef.isBarrier()) return 0;
      if (parentRef.isLeaf()) return 0;
      AABBNode* parent = parentRef.getAABBNode();
      
      /*! rotate all children first */
      vint4 cdepth;
      for (size_t c=0; c<4; c++)
	cdepth[c] = (int)rotate(parent->child(c),depth+1);
      
      /* compute current areas of all children */
      vfloat4 sizeX = parent->upper_x-parent->lower_x;
      vfloat4 sizeY = parent->upper_y-parent->lower_y;
      vfloat4 sizeZ = parent->upper_z-parent->lower_z;
      vfloat4 childArea = madd(sizeX,(sizeY + sizeZ),sizeY*sizeZ);
      
      /*! get node bounds */
      BBox<vfloat4> child1_0,child1_1,child1_2,child1_3;
      parent->bounds(child1_0,child1_1,child1_2,child1_3);
      
      /*! Find best rotation. We pick a first child (child1) and a sub-child 
	(child2child) of a different second child (child2), and swap child1 
	and child2child. We perform the best such swap. */
      float bestArea = 0;
      size_t bestChild1 = -1, bestChild2 = -1, bestChild2Child = -1;
      for (size_t c2=0; c2<4; c2++)
      {
	/*! ignore leaf nodes as we cannot descent into them */
	if (parent->child(c2).isBarrier()) continue;
	if (parent->child(c2).isLeaf()) continue;
	AABBNode* child2 = parent->child(c2).getAABBNode();
	
	/*! transpose child bounds */
	BBox<vfloat4> child2c0,child2c1,child2c2,child2c3;
	child2->bounds(child2c0,child2c1,child2c2,child2c3);
	
	/*! put child1_0 at each child2 position */
	float cost00 = halfArea3f(merge(child1_0,child2c1,child2c2,child2c3));
	float cost01 = halfArea3f(merge(child2c0,child1_0,child2c2,child2c3));
	float cost02 = halfArea3f(merge(child2c0,child2c1,child1_0,child2c3));
	float cost03 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_0));
	vfloat4 cost0 = vfloat4(cost00,cost01,cost02,cost03);
	vfloat4 min0 = vreduce_min(cost0);
	int pos0 = (int)bsf(movemask(min0 == cost0));
	
	/*! put child1_1 at each child2 position */
	float cost10 = halfArea3f(merge(child1_1,child2c1,child2c2,child2c3));
	float cost11 = halfArea3f(merge(child2c0,child1_1,child2c2,child2c3));
	float cost12 = halfArea3f(merge(child2c0,child2c1,child1_1,child2c3));
	float cost13 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_1));
	vfloat4 cost1 = vfloat4(cost10,cost11,cost12,cost13);
	vfloat4 min1 = vreduce_min(cost1);
	int pos1 = (int)bsf(movemask(min1 == cost1));
	
	/*! put child1_2 at each child2 position */
	float cost20 = halfArea3f(merge(child1_2,child2c1,child2c2,child2c3));
	float cost21 = halfArea3f(merge(child2c0,child1_2,child2c2,child2c3));
	float cost22 = halfArea3f(merge(child2c0,child2c1,child1_2,child2c3));
	float cost23 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_2));
	vfloat4 cost2 = vfloat4(cost20,cost21,cost22,cost23);
	vfloat4 min2 = vreduce_min(cost2);
	int pos2 = (int)bsf(movemask(min2 == cost2));
	
	/*! put child1_3 at each child2 position */
	float cost30 = halfArea3f(merge(child1_3,child2c1,child2c2,child2c3));
	float cost31 = halfArea3f(merge(child2c0,child1_3,child2c2,child2c3));
	float cost32 = halfArea3f(merge(child2c0,child2c1,child1_3,child2c3));
	float cost33 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_3));
	vfloat4 cost3 = vfloat4(cost30,cost31,cost32,cost33);
	vfloat4 min3 = vreduce_min(cost3);
	int pos3 = (int)bsf(movemask(min3 == cost3));
	
	/*! find best other child */
	vfloat4 area0123 = vfloat4(extract<0>(min0),extract<0>(min1),extract<0>(min2),extract<0>(min3)) - vfloat4(childArea[c2]);
	int pos[4] = { pos0,pos1,pos2,pos3 };
	const size_t mbd = BVH4::maxBuildDepth;
	vbool4 valid = vint4(int(depth+1))+cdepth <= vint4(mbd); // only select swaps that fulfill depth constraints
	valid &= vint4(int(c2)) != vint4(step);
	if (none(valid)) continue;
	size_t c1 = select_min(valid,area0123);
	float area = area0123[c1]; 
        if (c1 == c2) continue; // can happen if bounds are NANs
	
	/*! accept a swap when it reduces cost and is not swapping a node with itself */
	if (area < bestArea) {
	  bestArea = area;
	  bestChild1 = c1;
	  bestChild2 = c2;
	  bestChild2Child = pos[c1];
	}
      }
      
      /*! if we did not find a swap that improves the SAH then do nothing */
      if (bestChild1 == size_t(-1)) return 1+reduce_max(cdepth);
      
      /*! perform the best found tree rotation */
      AABBNode* child2 = parent->child(bestChild2).getAABBNode();
      AABBNode::swap(parent,bestChild1,child2,bestChild2Child);
      parent->setBounds(bestChild2,child2->bounds());
      AABBNode::compact(parent);
      AABBNode::compact(child2);
      
      /*! This returned depth is conservative as the child that was
       *  pulled up in the tree could have been on the critical path. */
      cdepth[bestChild1]++; // bestChild1 was pushed down one level
      return 1+reduce_max(cdepth); 
    }